

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::init_generator(t_rs_generator *this)

{
  char *pcVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  t_program *this_00;
  string *name;
  ostream *poVar3;
  int __oflag;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string f_gen_name;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  t_rs_generator *ptStack_10;
  int r;
  t_rs_generator *this_local;
  
  ptStack_10 = this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_14 = mkdir(pcVar1,0x1ff);
  if (local_14 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      f_gen_name.field_2._M_local_buf[0xb] = '\x01';
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
      std::operator+(&local_38,&local_58,": ");
      piVar2 = __errno_location();
      pcVar1 = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&local_38,pcVar1);
      f_gen_name.field_2._M_local_buf[0xb] = '\0';
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::operator+(&local_d0,&this->gen_dir_,"/");
  this_00 = t_generator::get_program(&this->super_t_generator);
  name = t_program::get_name_abi_cxx11_(this_00);
  rust_snake_case(&local_f0,this,name);
  std::operator+(&local_b0,&local_d0,&local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,".rs");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,pcVar1,&local_111);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_gen_,(char *)local_110,__oflag);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,"// ");
  (*(this->super_t_generator)._vptr_t_generator[0x1d])(local_138);
  poVar3 = std::operator<<(poVar3,local_138);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_138);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,
                           "// DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  render_attributes_and_includes(this);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void t_rs_generator::init_generator() {
  // make output directory for this thrift program
  MKDIR(gen_dir_.c_str());

  // create the file into which we're going to write the generated code
  string f_gen_name = gen_dir_ + "/" + rust_snake_case(get_program()->get_name()) + ".rs";
  f_gen_.open(f_gen_name.c_str());

  // header comment
  f_gen_ << "// " << autogen_summary() << endl;
  f_gen_ << "// DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING" << endl;
  f_gen_ << endl;

  render_attributes_and_includes();
}